

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

void ssh2_transport_special_cmd(PacketProtocolLayer *ppl,SessionSpecialCode code,int arg)

{
  ssh_keyalg *psVar1;
  char *pcVar2;
  
  if (code == SS_XCERT) {
    if (*(char *)&ppl[-9].in_pq != '\0') {
      return;
    }
    psVar1 = ssh2_hostkey_algs[arg].alg;
    ppl[-0xb].ic_process_queue.fn = (toplevel_callback_fn_t)psVar1;
    ppl[-1].interactor = (Interactor *)psVar1;
    pcVar2 = "cross-certifying new host key";
  }
  else {
    if (code != SS_REKEY) {
      (**(code **)(*ppl[-0xd].ic_process_queue.ctx + 0x18))();
      return;
    }
    if (*(char *)&ppl[-9].in_pq != '\0') {
      return;
    }
    pcVar2 = "at user request";
  }
  ppl[-0xb].vt = (PacketProtocolLayerVtable *)pcVar2;
  *(undefined4 *)&ppl[-0xb].bpp = 3;
  queue_idempotent_callback(&ppl->ic_process_queue);
  return;
}

Assistant:

static void ssh2_transport_special_cmd(PacketProtocolLayer *ppl,
                                       SessionSpecialCode code, int arg)
{
    struct ssh2_transport_state *s =
        container_of(ppl, struct ssh2_transport_state, ppl);

    if (code == SS_REKEY) {
        if (!s->kex_in_progress) {
            s->rekey_reason = "at user request";
            s->rekey_class = RK_NORMAL;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
        }
    } else if (code == SS_XCERT) {
        if (!s->kex_in_progress) {
            s->cross_certifying = s->hostkey_alg = ssh2_hostkey_algs[arg].alg;
            s->rekey_reason = "cross-certifying new host key";
            s->rekey_class = RK_NORMAL;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
        }
    } else {
        /* Send everything else to the next layer up. This includes
         * SS_PING/SS_NOP, which we _could_ handle here - but it's
         * better to put them in the connection layer, so they'll
         * still work in bare connection mode. */
        ssh_ppl_special_cmd(s->higher_layer, code, arg);
    }
}